

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::memidx<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  undefined8 this;
  bool bVar1;
  Ok *u;
  allocator<char> local_e9;
  string local_e8;
  Err local_c8;
  uint local_a4;
  Err local_a0;
  Err *local_80;
  Err *err;
  MaybeResult<wasm::WATParser::Ok> _val;
  undefined1 local_40 [8];
  MaybeResult<wasm::WATParser::Ok> idx;
  ParseDeclsCtx *ctx_local;
  
  idx.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
  _32_8_ = ctx;
  maybeMemidx<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
            ((MaybeResult<wasm::WATParser::Ok> *)local_40,ctx);
  bVar1 = WATParser::MaybeResult::operator_cast_to_bool((MaybeResult *)local_40);
  if (bVar1) {
    MaybeResult<wasm::WATParser::Ok>::MaybeResult
              ((MaybeResult<wasm::WATParser::Ok> *)&err,(MaybeResult<wasm::WATParser::Ok> *)local_40
              );
    local_80 = MaybeResult<wasm::WATParser::Ok>::getErr((MaybeResult<wasm::WATParser::Ok> *)&err);
    bVar1 = local_80 != (Err *)0x0;
    if (bVar1) {
      WATParser::Err::Err(&local_a0,local_80);
      Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_a0);
      WATParser::Err::~Err(&local_a0);
    }
    local_a4 = (uint)bVar1;
    MaybeResult<wasm::WATParser::Ok>::~MaybeResult((MaybeResult<wasm::WATParser::Ok> *)&err);
    if (local_a4 == 0) {
      u = MaybeResult<wasm::WATParser::Ok>::operator*((MaybeResult<wasm::WATParser::Ok> *)local_40);
      Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok&>(__return_storage_ptr__,u);
      local_a4 = 1;
    }
  }
  else {
    local_a4 = 0;
  }
  MaybeResult<wasm::WATParser::Ok>::~MaybeResult((MaybeResult<wasm::WATParser::Ok> *)local_40);
  this = idx.val.
         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
         super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         ._32_8_;
  if (local_a4 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"expected memory index or identifier",&local_e9);
    ParseInput::err(&local_c8,(ParseInput *)this,&local_e8);
    Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_c8);
    WATParser::Err::~Err(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::MemoryIdxT> memidx(Ctx& ctx) {
  if (auto idx = maybeMemidx(ctx)) {
    CHECK_ERR(idx);
    return *idx;
  }
  return ctx.in.err("expected memory index or identifier");
}